

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

SHMPTR SHMLinkPool(SHMPTR first,int block_size,int num_blocks)

{
  void *pvVar1;
  int local_34;
  SHMPTR SStack_30;
  int i;
  SHMPTR next_shmptr;
  SHMPTR *shmptr_ptr;
  LPBYTE item_ptr;
  int num_blocks_local;
  int block_size_local;
  SHMPTR first_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pvVar1 = Volatile<void_*>::Load(shm_segment_bases + (first >> 0x18 & 0xff));
  shmptr_ptr = (SHMPTR *)((long)pvVar1 + (first & 0xffffff));
  SStack_30 = first;
  for (local_34 = 0; local_34 < num_blocks; local_34 = local_34 + 1) {
    SStack_30 = (long)block_size + SStack_30;
    *shmptr_ptr = SStack_30;
    shmptr_ptr = (SHMPTR *)((long)shmptr_ptr + (long)block_size);
  }
  *(undefined8 *)((long)shmptr_ptr - (long)block_size) = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return SStack_30 - (long)block_size;
}

Assistant:

static SHMPTR SHMLinkPool(SHMPTR first, int block_size, int num_blocks)
{
    LPBYTE item_ptr;
    SHMPTR *shmptr_ptr;
    SHMPTR next_shmptr;
    int i;

    TRACE("Linking %d blocks of %d bytes, starting at 0x%08x\n",
          num_blocks, block_size, first);

    item_ptr = static_cast<LPBYTE>(
        static_cast<LPBYTE>(shm_segment_bases[SHMPTR_SEGMENT(first)].Load()) +
            (SHMPTR_OFFSET(first)));
    next_shmptr = first/*+block_size*/;

    /* Link blocks together */
    for(i=0; i<num_blocks; i++)
    {
        next_shmptr += block_size;

        /* item_ptr is char * (so we can increment with +=blocksize), we cast
           it to a SHMPTR * and set its content to the next SHMPTR in the list*/
        shmptr_ptr = (SHMPTR *)item_ptr;
        *shmptr_ptr = next_shmptr;

        item_ptr+=block_size;
    }
    /* Last SHMPTR in the list must point to NULL */
    item_ptr-=block_size;
    shmptr_ptr = (SHMPTR *)item_ptr;
    *shmptr_ptr = 0;

    /* Return SHMPTR of last element in the list */
    next_shmptr -= block_size;

    TRACE("New linked pool goes from 0x%08x to 0x%08x\n", first, next_shmptr);
    return next_shmptr;
}